

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_setup_connection(connectdata *conn)

{
  char **ppcVar1;
  SessionHandle *data_00;
  CURLcode CVar2;
  void *pvVar3;
  SessionHandle *data;
  
  data_00 = conn->data;
  pvVar3 = (*Curl_ccalloc)(0x18,1);
  (data_00->req).protop = pvVar3;
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (pvVar3 != (void *)0x0) {
    if (((conn->bits).httpproxy == true) && ((data_00->set).tunnel_thru_httpproxy == false)) {
      if (conn->handler == &Curl_handler_pop3) {
        conn->handler = &Curl_handler_pop3_proxy;
        CVar2 = Curl_http_setup_conn(conn);
        return CVar2;
      }
      Curl_failf(data_00,"POP3S not supported!");
      CVar2 = CURLE_UNSUPPORTED_PROTOCOL;
    }
    else {
      ppcVar1 = &(data_00->state).path;
      *ppcVar1 = *ppcVar1 + 1;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode pop3_setup_connection(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;

  /* Initialise the POP3 layer */
  CURLcode result = pop3_init(conn);
  if(result)
    return result;

  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel POP3 operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_pop3)
      conn->handler = &Curl_handler_pop3_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_pop3s_proxy;
#else
      failf(data, "POP3S not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }

    /* set it up as an HTTP connection instead */
    return conn->handler->setup_connection(conn);
#else
    failf(data, "POP3 over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}